

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

int history_def_last(void *p,HistEvent_conflict *ev)

{
  undefined8 *puVar1;
  history_t *h;
  HistEvent_conflict *ev_local;
  void *p_local;
  
  *(undefined8 *)((long)p + 0x28) = *(undefined8 *)((long)p + 0x20);
  if (*(void **)((long)p + 0x28) == p) {
    ev->num = 4;
    ev->str = "last event not found";
    p_local._4_4_ = -1;
  }
  else {
    puVar1 = *(undefined8 **)((long)p + 0x28);
    *(undefined8 *)ev = *puVar1;
    ev->str = (char *)puVar1[1];
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int
history_def_last(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	h->cursor = h->list.prev;
	if (h->cursor != &h->list)
		*ev = h->cursor->ev;
	else {
		he_seterrev(ev, _HE_LAST_NOTFOUND);
		return -1;
	}

	return 0;
}